

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# join.hpp
# Opt level: O3

void __thiscall
ranges::
join_view<ranges::zip_with_view<ranges::views::concat_fn,_ranges::transform_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>,_ranges::views::single_fn>,_ranges::ref_view<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>_>
::cursor<false>::satisfy(cursor<false> *this)

{
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> _Var1;
  vector<double,_std::allocator<double>_> *pvVar2;
  Parent *pPVar3;
  join_view_inner<ranges::zip_with_view<ranges::views::concat_fn,_ranges::transform_view<ranges::ref_view<std::vector<double>_>,_ranges::views::single_fn>,_ranges::ref_view<std::vector<std::vector<double>_>_>_>_>
  *local_30;
  anon_union_8_2_3194c211_for_type_0 local_28;
  ulong local_20;
  
  pPVar3 = this->rng_;
  _Var1._M_current =
       *(double **)
        &(((_Head_base<0UL,_ranges::basic_iterator<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::iter_transform_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>,_ranges::indirected<ranges::views::single_fn>_>::adaptor<false>_>_>,_false>
            *)((long)&(this->outer_it_).
                      super_iterator_associated_types_base<ranges::iter_zip_with_view<ranges::indirected<ranges::views::concat_fn>,_ranges::transform_view<ranges::ref_view<std::vector<double>_>,_ranges::views::single_fn>,_ranges::ref_view<std::vector<std::vector<double>_>_>_>::cursor<false>_>
                      .
                      super_readable_iterator_associated_types_base<ranges::iter_zip_with_view<ranges::indirected<ranges::views::concat_fn>,_ranges::transform_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>,_ranges::views::single_fn>,_ranges::ref_view<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>::cursor<false>,_void>
                      .
                      super_mixin_base_t<ranges::iter_zip_with_view<ranges::indirected<ranges::views::concat_fn>,_ranges::transform_view<ranges::ref_view<std::vector<double>_>,_ranges::views::single_fn>,_ranges::ref_view<std::vector<std::vector<double>_>_>_>::cursor<false>_>
                      .
                      super_box<ranges::iter_zip_with_view<ranges::indirected<ranges::views::concat_fn>,_ranges::transform_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>,_ranges::views::single_fn>,_ranges::ref_view<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>::cursor<false>,_void,_(ranges::detail::box_compress)0>
                      .value.its_ + 8))->_M_head_impl).
         super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<double_*,_std::vector<double>_>,_ranges::iter_transform_view<ranges::ref_view<std::vector<double>_>,_ranges::indirected<ranges::views::single_fn>_>::adaptor<false>_>_>
         .
         super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::iter_transform_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>,_ranges::indirected<ranges::views::single_fn>_>::adaptor<false>_>,_void>
         .
         super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<double_*,_std::vector<double>_>,_ranges::iter_transform_view<ranges::ref_view<std::vector<double>_>,_ranges::indirected<ranges::views::single_fn>_>::adaptor<false>_>_>
         .
         super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::iter_transform_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>,_ranges::indirected<ranges::views::single_fn>_>::adaptor<false>_>_>
         .
         super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::iter_transform_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>,_ranges::indirected<ranges::views::single_fn>_>::adaptor<false>_>,_void,_(ranges::detail::box_compress)0>
         .value;
  if ((_Var1._M_current !=
       (((base_range_t *)
        ((long)&(pPVar3->outer_).
                super_iter_zip_with_view<ranges::indirected<ranges::views::concat_fn>,_ranges::transform_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>,_ranges::views::single_fn>,_ranges::ref_view<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                .rngs_.
                super__Tuple_impl<0UL,_ranges::transform_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>,_ranges::views::single_fn>,_ranges::ref_view<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                .
                super__Head_base<0UL,_ranges::transform_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>,_ranges::views::single_fn>,_false>
                ._M_head_impl + 8))->rng_->super__Vector_base<double,_std::allocator<double>_>).
       _M_impl.super__Vector_impl_data._M_finish) &&
     (pvVar2 = (this->outer_it_).
               super_iterator_associated_types_base<ranges::iter_zip_with_view<ranges::indirected<ranges::views::concat_fn>,_ranges::transform_view<ranges::ref_view<std::vector<double>_>,_ranges::views::single_fn>,_ranges::ref_view<std::vector<std::vector<double>_>_>_>::cursor<false>_>
               .
               super_readable_iterator_associated_types_base<ranges::iter_zip_with_view<ranges::indirected<ranges::views::concat_fn>,_ranges::transform_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>,_ranges::views::single_fn>,_ranges::ref_view<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>::cursor<false>,_void>
               .
               super_mixin_base_t<ranges::iter_zip_with_view<ranges::indirected<ranges::views::concat_fn>,_ranges::transform_view<ranges::ref_view<std::vector<double>_>,_ranges::views::single_fn>,_ranges::ref_view<std::vector<std::vector<double>_>_>_>::cursor<false>_>
               .
               super_box<ranges::iter_zip_with_view<ranges::indirected<ranges::views::concat_fn>,_ranges::transform_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>,_ranges::views::single_fn>,_ranges::ref_view<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>::cursor<false>,_void,_(ranges::detail::box_compress)0>
               .value.its_.
               super__Tuple_impl<0UL,_ranges::basic_iterator<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::iter_transform_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>,_ranges::indirected<ranges::views::single_fn>_>::adaptor<false>_>_>,___gnu_cxx::__normal_iterator<std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
               .
               super__Tuple_impl<1UL,___gnu_cxx::__normal_iterator<std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
               .
               super__Head_base<1UL,___gnu_cxx::__normal_iterator<std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>,_false>
               ._M_head_impl._M_current,
     pvVar2 != *(pointer *)
                ((long)&(((pPVar3->outer_).
                          super_iter_zip_with_view<ranges::indirected<ranges::views::concat_fn>,_ranges::transform_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>,_ranges::views::single_fn>,_ranges::ref_view<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                          .rngs_.
                          super__Tuple_impl<0UL,_ranges::transform_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>,_ranges::views::single_fn>,_ranges::ref_view<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                          .
                          super__Tuple_impl<1UL,_ranges::ref_view<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                          .
                          super__Head_base<1UL,_ranges::ref_view<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>,_false>
                          ._M_head_impl.rng_)->
                        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                        )._M_impl + 8))) {
    while( true ) {
      local_30 = &pPVar3->
                  super_join_view_inner<ranges::zip_with_view<ranges::views::concat_fn,_ranges::transform_view<ranges::ref_view<std::vector<double>_>,_ranges::views::single_fn>,_ranges::ref_view<std::vector<std::vector<double>_>_>_>_>
      ;
      local_28 = (anon_union_8_2_3194c211_for_type_0)
                 &(pPVar3->
                  super_join_view_inner<ranges::zip_with_view<ranges::views::concat_fn,_ranges::transform_view<ranges::ref_view<std::vector<double>_>,_ranges::views::single_fn>,_ranges::ref_view<std::vector<std::vector<double>_>_>_>_>
                  ).inner_.rngs_.
                  super__Tuple_impl<0UL,_ranges::single_view<double>,_ranges::ref_view<std::vector<double,_std::allocator<double>_>_>_>
                  .super__Head_base<0UL,_ranges::single_view<double>,_false>;
      (pPVar3->
      super_join_view_inner<ranges::zip_with_view<ranges::views::concat_fn,_ranges::transform_view<ranges::ref_view<std::vector<double>_>,_ranges::views::single_fn>,_ranges::ref_view<std::vector<std::vector<double>_>_>_>_>
      ).inner_.rngs_.
      super__Tuple_impl<0UL,_ranges::single_view<double>,_ranges::ref_view<std::vector<double,_std::allocator<double>_>_>_>
      .super__Head_base<0UL,_ranges::single_view<double>,_false>._M_head_impl.value_ =
           *_Var1._M_current;
      (pPVar3->
      super_join_view_inner<ranges::zip_with_view<ranges::views::concat_fn,_ranges::transform_view<ranges::ref_view<std::vector<double>_>,_ranges::views::single_fn>,_ranges::ref_view<std::vector<std::vector<double>_>_>_>_>
      ).inner_.rngs_.
      super__Tuple_impl<0UL,_ranges::single_view<double>,_ranges::ref_view<std::vector<double,_std::allocator<double>_>_>_>
      .super__Tuple_impl<1UL,_ranges::ref_view<std::vector<double,_std::allocator<double>_>_>_>.
      super__Head_base<1UL,_ranges::ref_view<std::vector<double,_std::allocator<double>_>_>,_false>.
      _M_head_impl.rng_ = pvVar2;
      local_20 = 0;
      concat_view<ranges::single_view<double>,ranges::ref_view<std::vector<double,std::allocator<double>>>>
      ::cursor<false>::satisfy<0ul>((cursor<false> *)&local_30);
      (this->inner_it_).
      super_iterator_associated_types_base<ranges::concat_view<ranges::single_view<double>,_ranges::ref_view<std::vector<double>_>_>::cursor<false>_>
      .
      super_readable_iterator_associated_types_base<ranges::concat_view<ranges::single_view<double>,_ranges::ref_view<std::vector<double,_std::allocator<double>_>_>_>::cursor<false>,_void>
      .
      super_mixin_base_t<ranges::concat_view<ranges::single_view<double>,_ranges::ref_view<std::vector<double>_>_>::cursor<false>_>
      .
      super_box<ranges::concat_view<ranges::single_view<double>,_ranges::ref_view<std::vector<double,_std::allocator<double>_>_>_>::cursor<false>,_void,_(ranges::detail::box_compress)0>
      .value.rng_ = &local_30->inner_;
      if (1 < local_20) break;
      (this->inner_it_).
      super_iterator_associated_types_base<ranges::concat_view<ranges::single_view<double>,_ranges::ref_view<std::vector<double>_>_>::cursor<false>_>
      .
      super_readable_iterator_associated_types_base<ranges::concat_view<ranges::single_view<double>,_ranges::ref_view<std::vector<double,_std::allocator<double>_>_>_>::cursor<false>,_void>
      .
      super_mixin_base_t<ranges::concat_view<ranges::single_view<double>,_ranges::ref_view<std::vector<double>_>_>::cursor<false>_>
      .
      super_box<ranges::concat_view<ranges::single_view<double>,_ranges::ref_view<std::vector<double,_std::allocator<double>_>_>_>::cursor<false>,_void,_(ranges::detail::box_compress)0>
      .value.its_.
      super_variant_data<double_*,___gnu_cxx::__normal_iterator<double_*,_std::vector<double>_>_>.
      field_0 = local_28;
      *(ulong *)((long)&(this->inner_it_).
                        super_iterator_associated_types_base<ranges::concat_view<ranges::single_view<double>,_ranges::ref_view<std::vector<double>_>_>::cursor<false>_>
                        .
                        super_readable_iterator_associated_types_base<ranges::concat_view<ranges::single_view<double>,_ranges::ref_view<std::vector<double,_std::allocator<double>_>_>_>::cursor<false>,_void>
                        .
                        super_mixin_base_t<ranges::concat_view<ranges::single_view<double>,_ranges::ref_view<std::vector<double>_>_>::cursor<false>_>
                        .
                        super_box<ranges::concat_view<ranges::single_view<double>,_ranges::ref_view<std::vector<double,_std::allocator<double>_>_>_>::cursor<false>,_void,_(ranges::detail::box_compress)0>
                        .value.its_ + 8) = local_20;
      if (local_20 != 1) {
        return;
      }
      if ((this->inner_it_).
          super_iterator_associated_types_base<ranges::concat_view<ranges::single_view<double>,_ranges::ref_view<std::vector<double>_>_>::cursor<false>_>
          .
          super_readable_iterator_associated_types_base<ranges::concat_view<ranges::single_view<double>,_ranges::ref_view<std::vector<double,_std::allocator<double>_>_>_>::cursor<false>,_void>
          .
          super_mixin_base_t<ranges::concat_view<ranges::single_view<double>,_ranges::ref_view<std::vector<double>_>_>::cursor<false>_>
          .
          super_box<ranges::concat_view<ranges::single_view<double>,_ranges::ref_view<std::vector<double,_std::allocator<double>_>_>_>::cursor<false>,_void,_(ranges::detail::box_compress)0>
          .value.its_.
          super_variant_data<double_*,___gnu_cxx::__normal_iterator<double_*,_std::vector<double>_>_>
          .field_0 !=
          *(anon_union_8_2_3194c211_for_type_0 *)
           ((long)&(((pPVar3->
                     super_join_view_inner<ranges::zip_with_view<ranges::views::concat_fn,_ranges::transform_view<ranges::ref_view<std::vector<double>_>,_ranges::views::single_fn>,_ranges::ref_view<std::vector<std::vector<double>_>_>_>_>
                     ).inner_.rngs_.
                     super__Tuple_impl<0UL,_ranges::single_view<double>,_ranges::ref_view<std::vector<double,_std::allocator<double>_>_>_>
                     .
                     super__Tuple_impl<1UL,_ranges::ref_view<std::vector<double,_std::allocator<double>_>_>_>
                     .
                     super__Head_base<1UL,_ranges::ref_view<std::vector<double,_std::allocator<double>_>_>,_false>
                     ._M_head_impl.rng_)->super__Vector_base<double,_std::allocator<double>_>).
                   _M_impl + 8)) {
        return;
      }
      _Var1._M_current =
           (double *)
           ((long)(((_Head_base<0UL,_ranges::basic_iterator<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::iter_transform_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>,_ranges::indirected<ranges::views::single_fn>_>::adaptor<false>_>_>,_false>
                     *)((long)&(this->outer_it_).
                               super_iterator_associated_types_base<ranges::iter_zip_with_view<ranges::indirected<ranges::views::concat_fn>,_ranges::transform_view<ranges::ref_view<std::vector<double>_>,_ranges::views::single_fn>,_ranges::ref_view<std::vector<std::vector<double>_>_>_>::cursor<false>_>
                               .
                               super_readable_iterator_associated_types_base<ranges::iter_zip_with_view<ranges::indirected<ranges::views::concat_fn>,_ranges::transform_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>,_ranges::views::single_fn>,_ranges::ref_view<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>::cursor<false>,_void>
                               .
                               super_mixin_base_t<ranges::iter_zip_with_view<ranges::indirected<ranges::views::concat_fn>,_ranges::transform_view<ranges::ref_view<std::vector<double>_>,_ranges::views::single_fn>,_ranges::ref_view<std::vector<std::vector<double>_>_>_>::cursor<false>_>
                               .
                               super_box<ranges::iter_zip_with_view<ranges::indirected<ranges::views::concat_fn>,_ranges::transform_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>,_ranges::views::single_fn>,_ranges::ref_view<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>::cursor<false>,_void,_(ranges::detail::box_compress)0>
                               .value.its_ + 8))->_M_head_impl).
                  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<double_*,_std::vector<double>_>,_ranges::iter_transform_view<ranges::ref_view<std::vector<double>_>,_ranges::indirected<ranges::views::single_fn>_>::adaptor<false>_>_>
                  .
                  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::iter_transform_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>,_ranges::indirected<ranges::views::single_fn>_>::adaptor<false>_>,_void>
                  .
                  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<double_*,_std::vector<double>_>,_ranges::iter_transform_view<ranges::ref_view<std::vector<double>_>,_ranges::indirected<ranges::views::single_fn>_>::adaptor<false>_>_>
                  .
                  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::iter_transform_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>,_ranges::indirected<ranges::views::single_fn>_>::adaptor<false>_>_>
                  .
                  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::iter_transform_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>,_ranges::indirected<ranges::views::single_fn>_>::adaptor<false>_>,_void,_(ranges::detail::box_compress)0>
                  .value + 8);
      (((_Head_base<0UL,_ranges::basic_iterator<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::iter_transform_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>,_ranges::indirected<ranges::views::single_fn>_>::adaptor<false>_>_>,_false>
         *)((long)&(this->outer_it_).
                   super_iterator_associated_types_base<ranges::iter_zip_with_view<ranges::indirected<ranges::views::concat_fn>,_ranges::transform_view<ranges::ref_view<std::vector<double>_>,_ranges::views::single_fn>,_ranges::ref_view<std::vector<std::vector<double>_>_>_>::cursor<false>_>
                   .
                   super_readable_iterator_associated_types_base<ranges::iter_zip_with_view<ranges::indirected<ranges::views::concat_fn>,_ranges::transform_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>,_ranges::views::single_fn>,_ranges::ref_view<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>::cursor<false>,_void>
                   .
                   super_mixin_base_t<ranges::iter_zip_with_view<ranges::indirected<ranges::views::concat_fn>,_ranges::transform_view<ranges::ref_view<std::vector<double>_>,_ranges::views::single_fn>,_ranges::ref_view<std::vector<std::vector<double>_>_>_>::cursor<false>_>
                   .
                   super_box<ranges::iter_zip_with_view<ranges::indirected<ranges::views::concat_fn>,_ranges::transform_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>,_ranges::views::single_fn>,_ranges::ref_view<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>::cursor<false>,_void,_(ranges::detail::box_compress)0>
                   .value.its_ + 8))->_M_head_impl).
      super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<double_*,_std::vector<double>_>,_ranges::iter_transform_view<ranges::ref_view<std::vector<double>_>,_ranges::indirected<ranges::views::single_fn>_>::adaptor<false>_>_>
      .
      super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::iter_transform_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>,_ranges::indirected<ranges::views::single_fn>_>::adaptor<false>_>,_void>
      .
      super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<double_*,_std::vector<double>_>,_ranges::iter_transform_view<ranges::ref_view<std::vector<double>_>,_ranges::indirected<ranges::views::single_fn>_>::adaptor<false>_>_>
      .
      super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::iter_transform_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>,_ranges::indirected<ranges::views::single_fn>_>::adaptor<false>_>_>
      .
      super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::iter_transform_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>,_ranges::indirected<ranges::views::single_fn>_>::adaptor<false>_>,_void,_(ranges::detail::box_compress)0>
      .value = (adaptor_cursor<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::iter_transform_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>,_ranges::indirected<ranges::views::single_fn>_>::adaptor<false>_>
                )_Var1._M_current;
      pPVar3 = this->rng_;
      pvVar2 = (this->outer_it_).
               super_iterator_associated_types_base<ranges::iter_zip_with_view<ranges::indirected<ranges::views::concat_fn>,_ranges::transform_view<ranges::ref_view<std::vector<double>_>,_ranges::views::single_fn>,_ranges::ref_view<std::vector<std::vector<double>_>_>_>::cursor<false>_>
               .
               super_readable_iterator_associated_types_base<ranges::iter_zip_with_view<ranges::indirected<ranges::views::concat_fn>,_ranges::transform_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>,_ranges::views::single_fn>,_ranges::ref_view<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>::cursor<false>,_void>
               .
               super_mixin_base_t<ranges::iter_zip_with_view<ranges::indirected<ranges::views::concat_fn>,_ranges::transform_view<ranges::ref_view<std::vector<double>_>,_ranges::views::single_fn>,_ranges::ref_view<std::vector<std::vector<double>_>_>_>::cursor<false>_>
               .
               super_box<ranges::iter_zip_with_view<ranges::indirected<ranges::views::concat_fn>,_ranges::transform_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>,_ranges::views::single_fn>,_ranges::ref_view<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>::cursor<false>,_void,_(ranges::detail::box_compress)0>
               .value.its_.
               super__Tuple_impl<0UL,_ranges::basic_iterator<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::iter_transform_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>,_ranges::indirected<ranges::views::single_fn>_>::adaptor<false>_>_>,___gnu_cxx::__normal_iterator<std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
               .
               super__Tuple_impl<1UL,___gnu_cxx::__normal_iterator<std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
               .
               super__Head_base<1UL,___gnu_cxx::__normal_iterator<std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>,_false>
               ._M_head_impl._M_current + 1;
      (this->outer_it_).
      super_iterator_associated_types_base<ranges::iter_zip_with_view<ranges::indirected<ranges::views::concat_fn>,_ranges::transform_view<ranges::ref_view<std::vector<double>_>,_ranges::views::single_fn>,_ranges::ref_view<std::vector<std::vector<double>_>_>_>::cursor<false>_>
      .
      super_readable_iterator_associated_types_base<ranges::iter_zip_with_view<ranges::indirected<ranges::views::concat_fn>,_ranges::transform_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>,_ranges::views::single_fn>,_ranges::ref_view<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>::cursor<false>,_void>
      .
      super_mixin_base_t<ranges::iter_zip_with_view<ranges::indirected<ranges::views::concat_fn>,_ranges::transform_view<ranges::ref_view<std::vector<double>_>,_ranges::views::single_fn>,_ranges::ref_view<std::vector<std::vector<double>_>_>_>::cursor<false>_>
      .
      super_box<ranges::iter_zip_with_view<ranges::indirected<ranges::views::concat_fn>,_ranges::transform_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>,_ranges::views::single_fn>,_ranges::ref_view<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>::cursor<false>,_void,_(ranges::detail::box_compress)0>
      .value.its_.
      super__Tuple_impl<0UL,_ranges::basic_iterator<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::iter_transform_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>,_ranges::indirected<ranges::views::single_fn>_>::adaptor<false>_>_>,___gnu_cxx::__normal_iterator<std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
      .
      super__Tuple_impl<1UL,___gnu_cxx::__normal_iterator<std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
      .
      super__Head_base<1UL,___gnu_cxx::__normal_iterator<std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>,_false>
      ._M_head_impl._M_current = pvVar2;
      if (_Var1._M_current ==
          (((base_range_t *)
           ((long)&(pPVar3->outer_).
                   super_iter_zip_with_view<ranges::indirected<ranges::views::concat_fn>,_ranges::transform_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>,_ranges::views::single_fn>,_ranges::ref_view<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                   .rngs_.
                   super__Tuple_impl<0UL,_ranges::transform_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>,_ranges::views::single_fn>,_ranges::ref_view<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                   .
                   super__Head_base<0UL,_ranges::transform_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>,_ranges::views::single_fn>,_false>
                   ._M_head_impl + 8))->rng_->super__Vector_base<double,_std::allocator<double>_>).
          _M_impl.super__Vector_impl_data._M_finish) {
        return;
      }
      if (pvVar2 == *(pointer *)
                     ((long)&(((pPVar3->outer_).
                               super_iter_zip_with_view<ranges::indirected<ranges::views::concat_fn>,_ranges::transform_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>,_ranges::views::single_fn>,_ranges::ref_view<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                               .rngs_.
                               super__Tuple_impl<0UL,_ranges::transform_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>,_ranges::views::single_fn>,_ranges::ref_view<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                               .
                               super__Tuple_impl<1UL,_ranges::ref_view<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                               .
                               super__Head_base<1UL,_ranges::ref_view<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>,_false>
                               ._M_head_impl.rng_)->
                             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             )._M_impl + 8)) {
        return;
      }
    }
    *(size_t *)
     ((long)&(this->inner_it_).
             super_iterator_associated_types_base<ranges::concat_view<ranges::single_view<double>,_ranges::ref_view<std::vector<double>_>_>::cursor<false>_>
             .
             super_readable_iterator_associated_types_base<ranges::concat_view<ranges::single_view<double>,_ranges::ref_view<std::vector<double,_std::allocator<double>_>_>_>::cursor<false>,_void>
             .
             super_mixin_base_t<ranges::concat_view<ranges::single_view<double>,_ranges::ref_view<std::vector<double>_>_>::cursor<false>_>
             .
             super_box<ranges::concat_view<ranges::single_view<double>,_ranges::ref_view<std::vector<double,_std::allocator<double>_>_>_>::cursor<false>,_void,_(ranges::detail::box_compress)0>
             .value.its_ + 8) = 2;
  }
  return;
}

Assistant:

void satisfy()
            {
                for(; outer_it_ != ranges::end(rng_->outer_); ++outer_it_)
                {
                    auto & inner = rng_->update_inner_(*outer_it_);
                    inner_it_ = ranges::begin(inner);
                    if(inner_it_ != ranges::end(inner))
                        return;
                }
                if(RANGES_CONSTEXPR_IF(ref_is_glvalue::value))
                    inner_it_ = iterator_t<CInner>();
            }